

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

int zstat(char **argv)

{
  FILE *__stream;
  int iVar1;
  ulonglong uVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined1 local_108 [8];
  tm tm;
  tm *tpm;
  zip_stat sb;
  char buf [100];
  zip_uint64_t idx;
  char **argv_local;
  
  uVar2 = strtoull(*argv,(char **)0x0,10);
  iVar1 = zip_stat_index(za,uVar2,stat_flags,&tpm);
  __stream = _stderr;
  if (iVar1 < 0) {
    uVar3 = zip_strerror(za);
    fprintf(__stream,"zip_stat_index failed on \'%lu\' failed: %s\n",uVar2,uVar3);
    argv_local._4_4_ = -1;
  }
  else {
    if (((ulong)tpm & 1) != 0) {
      pcVar4 = encode_filename((char *)sb.valid);
      printf("name: \'%s\'\n",pcVar4);
    }
    if (((ulong)tpm & 2) != 0) {
      printf("index: \'%lu\'\n",sb.name);
    }
    if (((ulong)tpm & 4) != 0) {
      printf("size: \'%lu\'\n",sb.index);
    }
    if (((ulong)tpm & 8) != 0) {
      printf("compressed size: \'%lu\'\n",sb.size);
    }
    if (((ulong)tpm & 0x10) != 0) {
      tm.tm_zone = (char *)localtime_r((time_t *)&sb.comp_size,(tm *)local_108);
      if ((tm *)tm.tm_zone == (tm *)0x0) {
        printf("mtime: <not valid>\n");
      }
      else {
        strftime((char *)&sb.flags,100,"%a %b %d %Y %H:%M:%S",(tm *)tm.tm_zone);
        printf("mtime: \'%s\'\n",&sb.flags);
      }
    }
    if (((ulong)tpm & 0x20) != 0) {
      printf("crc: \'%0x\'\n",(ulong)(uint)sb.mtime);
    }
    if (((ulong)tpm & 0x40) != 0) {
      printf("compression method: \'%d\'\n",(ulong)sb.mtime._4_2_);
    }
    if (((ulong)tpm & 0x80) != 0) {
      printf("encryption method: \'%d\'\n",(ulong)sb.mtime._6_2_);
    }
    if (((ulong)tpm & 0x100) != 0) {
      printf("flags: \'%ld\'\n",(ulong)sb.crc);
    }
    printf("\n");
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

static int
zstat(char *argv[]) {
    zip_uint64_t idx;
    char buf[100];
    struct zip_stat sb;
    idx = strtoull(argv[0], NULL, 10);

    if (zip_stat_index(za, idx, stat_flags, &sb) < 0) {
        fprintf(stderr, "zip_stat_index failed on '%" PRIu64 "' failed: %s\n", idx, zip_strerror(za));
        return -1;
    }

    if (sb.valid & ZIP_STAT_NAME)
        printf("name: '%s'\n", encode_filename(sb.name));
    if (sb.valid & ZIP_STAT_INDEX)
        printf("index: '%" PRIu64 "'\n", sb.index);
    if (sb.valid & ZIP_STAT_SIZE)
        printf("size: '%" PRIu64 "'\n", sb.size);
    if (sb.valid & ZIP_STAT_COMP_SIZE)
        printf("compressed size: '%" PRIu64 "'\n", sb.comp_size);
    if (sb.valid & ZIP_STAT_MTIME) {
        struct tm *tpm;
        struct tm tm;
        tpm = zip_localtime(&sb.mtime, &tm);
        if (tpm == NULL) {
            printf("mtime: <not valid>\n");
        }
        else {
            strftime(buf, sizeof(buf), "%a %b %d %Y %H:%M:%S", tpm);
            printf("mtime: '%s'\n", buf);
        }
    }
    if (sb.valid & ZIP_STAT_CRC)
        printf("crc: '%0x'\n", sb.crc);
    if (sb.valid & ZIP_STAT_COMP_METHOD)
        printf("compression method: '%d'\n", sb.comp_method);
    if (sb.valid & ZIP_STAT_ENCRYPTION_METHOD)
        printf("encryption method: '%d'\n", sb.encryption_method);
    if (sb.valid & ZIP_STAT_FLAGS)
        printf("flags: '%ld'\n", (long)sb.flags);
    printf("\n");

    return 0;
}